

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O0

int32_t icu_63::Hangul::decompose(UChar32 c,UChar *buffer)

{
  int iVar1;
  int iVar2;
  UChar32 c2;
  UChar *buffer_local;
  UChar32 c_local;
  
  iVar2 = (c + -0xac00) % 0x1c;
  iVar1 = (c + -0xac00) / 0x1c;
  *buffer = (short)(iVar1 / 0x15) + L'ᄀ';
  buffer[1] = (short)(iVar1 % 0x15) + L'ᅡ';
  if (iVar2 == 0) {
    buffer_local._4_4_ = 2;
  }
  else {
    buffer[2] = (short)iVar2 + L'ᆧ';
    buffer_local._4_4_ = 3;
  }
  return buffer_local._4_4_;
}

Assistant:

static inline int32_t decompose(UChar32 c, UChar buffer[3]) {
        c-=HANGUL_BASE;
        UChar32 c2=c%JAMO_T_COUNT;
        c/=JAMO_T_COUNT;
        buffer[0]=(UChar)(JAMO_L_BASE+c/JAMO_V_COUNT);
        buffer[1]=(UChar)(JAMO_V_BASE+c%JAMO_V_COUNT);
        if(c2==0) {
            return 2;
        } else {
            buffer[2]=(UChar)(JAMO_T_BASE+c2);
            return 3;
        }
    }